

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O1

void __thiscall Client::~Client(Client *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->_svr_ip)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_svr_ip).field_2) {
    operator_delete(pcVar1);
  }
  Epoll::~Epoll(&this->_epoll);
  return;
}

Assistant:

Client(const std::string& ip, const int port):
        _epoll(), _sock_fd(-1), _svr_ip(ip), _svr_port(port), 
        _stdin2sock(), _sock2stdout(), _stdineof(false)
    {

    }